

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O0

double __thiscall MotionTrajectory::CalculateNextTime(MotionTrajectory *this,int *curDir)

{
  ulong uVar1;
  reference ppMVar2;
  size_type sVar3;
  ostream *poVar4;
  void *this_00;
  bool bVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double local_68;
  int endPos;
  double af;
  double vf;
  double pf;
  double tf;
  double t;
  int *curDir_local;
  MotionTrajectory *this_local;
  
  t = (double)curDir;
  curDir_local = (int *)this;
  ppMVar2 = std::vector<MotionBase_*,_std::allocator<MotionBase_*>_>::operator[]
                      (&this->motionList,this->curIndex);
  (*(*ppMVar2)->_vptr_MotionBase[2])(this->tCur,*ppMVar2,&this->pos,t);
  tf = extraout_XMM0_Qa;
  while( true ) {
    bVar5 = false;
    if (tf < 0.0) {
      uVar1 = this->curIndex;
      sVar3 = std::vector<MotionBase_*,_std::allocator<MotionBase_*>_>::size(&this->motionList);
      bVar5 = uVar1 < sVar3 - 1;
    }
    if (!bVar5) break;
    ppMVar2 = std::vector<MotionBase_*,_std::allocator<MotionBase_*>_>::operator[]
                        (&this->motionList,this->curIndex);
    MotionBase::GetFinalValues(*ppMVar2,&pf,&vf,&af,(double *)&stack0xffffffffffffffc0);
    if (this->tCur < pf) {
      this->tCur = pf;
    }
    local_68 = 0.999999999;
    if (*(int *)t != -1) {
      local_68 = 0.0;
    }
    if (this->pos != (int)(vf + local_68)) {
      poVar4 = std::operator<<((ostream *)&std::cout,"CalculateNextTime: pos = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->pos);
      poVar4 = std::operator<<(poVar4,", pf = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,vf);
      poVar4 = std::operator<<(poVar4,", dir = ");
      this_00 = (void *)std::ostream::operator<<(poVar4,*(int *)t);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    this->curIndex = this->curIndex + 1;
    ppMVar2 = std::vector<MotionBase_*,_std::allocator<MotionBase_*>_>::operator[]
                        (&this->motionList,this->curIndex);
    (*(*ppMVar2)->_vptr_MotionBase[2])(this->tCur,*ppMVar2,&this->pos,t);
    tf = extraout_XMM0_Qa_00;
  }
  if (0.0 <= tf) {
    this->tCur = tf;
  }
  return tf;
}

Assistant:

double MotionTrajectory::CalculateNextTime(int &curDir)
{
    double t = motionList[curIndex]->CalculateNextTime(tCur, pos, curDir);
    while ((t < 0.0) && (curIndex < motionList.size()-1)) {
        double tf, pf, vf, af;
        motionList[curIndex]->GetFinalValues(tf, pf, vf, af);
        if (tCur < tf)
            tCur = tf;
        int endPos = static_cast<int>(pf + ((curDir == -1) ? (1-TINY) : 0));
        if (pos != endPos)
            std::cout << "CalculateNextTime: pos = " << pos << ", pf = " << pf << ", dir = " << curDir << std::endl;
        curIndex++;
        t = motionList[curIndex]->CalculateNextTime(tCur, pos, curDir);
    }
    if (t >= 0.0)
        tCur = t;
    return t;
}